

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_crop.c
# Opt level: O1

gdImagePtr gdImageCropAuto(gdImagePtr im,uint mode)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  gdImagePtr pgVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int x;
  int iVar15;
  int iVar16;
  bool bVar17;
  gdRect local_48;
  
  x = im->sx;
  iVar1 = im->sy;
  local_48.x = 0;
  local_48.y = 0;
  local_48.width = 0;
  local_48.height = 0;
  switch(mode) {
  default:
    uVar9 = im->transparent;
    goto LAB_0011319a;
  case 2:
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    break;
  case 3:
    iVar12 = 0xff;
    iVar13 = 0xff;
    iVar14 = 0xff;
    break;
  case 4:
    uVar6 = gdImageGetPixel(im,0,0);
    uVar3 = gdImageGetPixel(im,im->sx + -1,0);
    uVar4 = gdImageGetPixel(im,0,im->sy + -1);
    uVar5 = gdImageGetPixel(im,im->sx + -1,im->sy + -1);
    uVar9 = uVar3;
    if ((uVar3 == uVar5 && uVar3 == uVar4) || (uVar9 = uVar6, uVar6 == uVar5 && uVar6 == uVar4))
    goto LAB_0011319a;
    uVar9 = uVar3;
    if ((uVar6 == uVar3 || uVar6 == uVar4) || uVar6 == uVar5) {
      uVar9 = uVar6;
    }
    if (((uVar3 == uVar4) || ((uVar6 == uVar3 || uVar6 == uVar4) || uVar6 == uVar5)) ||
       (uVar9 = uVar4, uVar5 == uVar4)) goto LAB_0011319a;
    iVar16 = im->trueColor;
    if (iVar16 == 0) {
      uVar9 = im->red[(int)uVar6];
      uVar8 = im->red[(int)uVar3];
    }
    else {
      uVar9 = uVar6 >> 0x10 & 0xff;
      uVar8 = uVar3 >> 0x10 & 0xff;
    }
    if (iVar16 == 0) {
      uVar10 = im->red[(int)uVar4];
    }
    else {
      uVar10 = uVar4 >> 0x10 & 0xff;
    }
    iVar14 = uVar8 + uVar9 + uVar10;
    if (iVar16 == 0) {
      uVar9 = im->red[(int)uVar5];
    }
    else {
      uVar9 = uVar5 >> 0x10 & 0xff;
    }
    iVar13 = iVar14 + uVar9;
    iVar14 = iVar14 + 3 + uVar9;
    if (-1 < iVar13) {
      iVar14 = iVar13;
    }
    if (iVar16 == 0) {
      uVar9 = im->green[(int)uVar6];
      uVar8 = im->green[(int)uVar3];
    }
    else {
      uVar9 = uVar6 >> 8 & 0xff;
      uVar8 = uVar3 >> 8 & 0xff;
    }
    if (iVar16 == 0) {
      uVar10 = im->green[(int)uVar4];
    }
    else {
      uVar10 = uVar4 >> 8 & 0xff;
    }
    iVar13 = uVar8 + uVar9 + uVar10;
    if (iVar16 == 0) {
      uVar9 = im->green[(int)uVar5];
    }
    else {
      uVar9 = uVar5 >> 8 & 0xff;
    }
    iVar11 = iVar13 + uVar9;
    iVar13 = iVar13 + 3 + uVar9;
    if (-1 < iVar11) {
      iVar13 = iVar11;
    }
    if (iVar16 == 0) {
      uVar9 = im->blue[(int)uVar6];
      uVar8 = im->blue[(int)uVar3];
    }
    else {
      uVar9 = uVar6 & 0xff;
      uVar8 = uVar3 & 0xff;
    }
    if (iVar16 == 0) {
      uVar10 = im->blue[(int)uVar4];
    }
    else {
      uVar10 = uVar4 & 0xff;
    }
    iVar11 = uVar8 + uVar9 + uVar10;
    if (iVar16 == 0) {
      uVar9 = im->blue[(int)uVar5];
    }
    else {
      uVar9 = uVar5 & 0xff;
    }
    iVar12 = iVar11 + uVar9;
    iVar11 = iVar11 + 3 + uVar9;
    if (-1 < iVar12) {
      iVar11 = iVar12;
    }
    if (iVar16 == 0) {
      uVar9 = im->alpha[(int)uVar6];
    }
    else {
      uVar9 = uVar6 >> 0x18 & 0x7f;
    }
    if (iVar16 == 0) {
      uVar6 = im->alpha[(int)uVar3];
    }
    else {
      uVar6 = uVar3 >> 0x18 & 0x7f;
    }
    if (iVar16 == 0) {
      uVar3 = im->alpha[(int)uVar4];
    }
    else {
      uVar3 = uVar4 >> 0x18 & 0x7f;
    }
    iVar12 = (int)((float)(iVar14 >> 2) + 0.5);
    iVar13 = (int)((float)(iVar13 >> 2) + 0.5);
    iVar15 = uVar6 + uVar9 + uVar3;
    iVar14 = (int)((float)(iVar11 >> 2) + 0.5);
    if (iVar16 == 0) {
      uVar9 = im->alpha[(int)uVar5];
    }
    else {
      uVar9 = uVar5 >> 0x18 & 0x7f;
    }
    iVar11 = iVar15 + uVar9;
    iVar16 = iVar15 + 3 + uVar9;
    if (-1 < iVar11) {
      iVar16 = iVar11;
    }
    iVar16 = (int)((float)(iVar16 >> 2) + 0.5);
    goto LAB_00113193;
  }
  iVar16 = 0;
LAB_00113193:
  uVar9 = gdImageColorClosestAlpha(im,iVar12,iVar13,iVar14,iVar16);
LAB_0011319a:
  iVar14 = 0;
  iVar16 = 0;
  if (0 < iVar1) {
    do {
      if (x < 1) {
        bVar17 = true;
      }
      else {
        iVar14 = 1;
        do {
          uVar6 = gdImageGetPixel(im,iVar14 + -1,iVar16);
          bVar17 = uVar9 == uVar6;
          if (!bVar17) break;
          bVar2 = iVar14 < x;
          iVar14 = iVar14 + 1;
        } while (bVar2);
      }
      iVar14 = iVar16 + 1;
    } while ((bVar17) && (iVar16 = iVar14, iVar14 < iVar1));
  }
  if (iVar14 == iVar1 + -1) {
    pgVar7 = (gdImagePtr)0x0;
  }
  else {
    local_48.y = iVar14 + -1;
    iVar13 = iVar1 + -1;
    iVar16 = iVar1;
    do {
      iVar11 = iVar13;
      iVar13 = iVar11;
      if (iVar16 < 1) break;
      if (x < 1) {
        bVar17 = true;
      }
      else {
        iVar16 = 1;
        do {
          uVar6 = gdImageGetPixel(im,iVar16 + -1,iVar11);
          bVar17 = uVar9 == uVar6;
          if (!bVar17) break;
          bVar2 = iVar16 < x;
          iVar16 = iVar16 + 1;
        } while (bVar2);
      }
      iVar13 = iVar11 + -1;
      iVar16 = iVar11;
    } while (bVar17);
    iVar1 = (iVar1 - iVar14) + 2;
    if (iVar13 != 0) {
      iVar1 = (iVar13 - iVar14) + 3;
    }
    local_48.height = iVar1;
    if (x < 1) {
      iVar16 = 0;
    }
    else {
      iVar13 = iVar1 + iVar14 + -2;
      iVar16 = 0;
      do {
        if (iVar13 < 1) {
          bVar17 = true;
        }
        else {
          iVar11 = 1;
          do {
            uVar6 = gdImageGetPixel(im,iVar16,iVar11 + -1);
            bVar17 = uVar9 == uVar6;
            if (!bVar17) break;
            bVar2 = iVar11 < iVar13;
            iVar11 = iVar11 + 1;
          } while (bVar2);
        }
        iVar16 = iVar16 + 1;
      } while ((bVar17) && (iVar16 < x));
    }
    local_48.x = iVar16 + -1;
    if (0 < x) {
      iVar14 = iVar14 + iVar1 + -2;
      iVar1 = x;
      do {
        x = iVar1 + -1;
        if (iVar14 < 1) {
          bVar17 = true;
        }
        else {
          iVar13 = 1;
          do {
            uVar6 = gdImageGetPixel(im,x,iVar13 + -1);
            bVar17 = uVar9 == uVar6;
            if (!bVar17) break;
            bVar2 = iVar13 < iVar14;
            iVar13 = iVar13 + 1;
          } while (bVar2);
        }
      } while ((bVar17) && (bVar17 = 1 < iVar1, iVar1 = x, bVar17));
    }
    local_48.width = (x - iVar16) + 2;
    pgVar7 = gdImageCrop(im,&local_48);
  }
  return pgVar7;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCropAuto(gdImagePtr im, const unsigned int mode)
{
	const int width = gdImageSX(im);
	const int height = gdImageSY(im);

	int x,y;
	int color, match;
	gdRect crop;

	crop.x = 0;
	crop.y = 0;
	crop.width = 0;
	crop.height = 0;

	switch (mode) {
	case GD_CROP_TRANSPARENT:
		color = gdImageGetTransparent(im);
		break;

	case GD_CROP_BLACK:
		color = gdImageColorClosestAlpha(im, 0, 0, 0, 0);
		break;

	case GD_CROP_WHITE:
		color = gdImageColorClosestAlpha(im, 255, 255, 255, 0);
		break;

	case GD_CROP_SIDES:
		gdGuessBackgroundColorFromCorners(im, &color);
		break;

	case GD_CROP_DEFAULT:
	default:
		color = gdImageGetTransparent(im);
		break;
	}

	/* TODO: Add gdImageGetRowPtr and works with ptr at the row level
	 * for the true color and palette images
	 * new formats will simply work with ptr
	 */
	match = 1;
	for (y = 0; match && y < height; y++) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	/* Nothing to do > bye
	 * Duplicate the image?
	 */
	if (y == height - 1) {
		return NULL;
	}

	crop.y = y -1;
	match = 1;
	for (y = height - 1; match && y >= 0; y--) {
		for (x = 0; match && x < width; x++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}

	if (y == 0) {
		crop.height = height - crop.y + 1;
	} else {
		crop.height = y - crop.y + 2;
	}

	match = 1;
	for (x = 0; match && x < width; x++) {
		for (y = 0; match && y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.x = x - 1;

	match = 1;
	for (x = width - 1; match && x >= 0; x--) {
		for (y = 0; match &&  y < crop.y + crop.height - 1; y++) {
			match = (color == gdImageGetPixel(im, x,y));
		}
	}
	crop.width = x - crop.x + 2;

	return gdImageCrop(im, &crop);
}